

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O2

void * utf8ncpy(void *dst,void *src,size_t n)

{
  long lVar1;
  char *s;
  size_t sVar2;
  char cVar3;
  char *d;
  long lVar4;
  
  cVar3 = *src;
  lVar1 = 0;
  do {
    lVar4 = lVar1;
    *(char *)((long)dst + lVar4) = cVar3;
    cVar3 = *(char *)((long)src + lVar4 + 1);
    if (cVar3 == '\0') goto LAB_0010ee87;
    n = n - 1;
    lVar1 = lVar4 + 1;
  } while (n != 0);
  n = 0;
LAB_0010ee87:
  for (sVar2 = 0; n != sVar2; sVar2 = sVar2 + 1) {
    *(undefined1 *)((long)dst + lVar4 + sVar2 + 1) = 0;
  }
  return dst;
}

Assistant:

void *utf8ncpy(void *dst, const void *src, size_t n) {
  char *d = (char *)dst;
  const char *s = (const char *)src;

  // overwriting anything previously in dst, write byte-by-byte
  // from src
  do {
    *d++ = *s++;
  } while (('\0' != *s) && (0 != --n));

  // append null terminating byte
  while (0 != n) {
    *d++ = '\0';
    n--;
  }

  return dst;
}